

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::CheckUint(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
            *this,Context *context,uint64_t i)

{
  bool bVar1;
  ValueType *pVVar2;
  Ch *pCVar3;
  uint64_t uVar4;
  ValidateErrorCode VVar5;
  undefined4 uVar6;
  undefined4 uVar10;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint64_t i_local;
  Context *context_local;
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_local;
  
  if ((this->type_ & 0x60) == 0) {
    pVVar2 = GetIntegerString();
    DisallowedType(this,context,pVVar2);
    context->invalidCode = kValidateErrorType;
    pVVar2 = GetValidateErrorKeyword(kValidateErrorType);
    pCVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pVVar2);
    context->invalidKeyword = pCVar3;
    return false;
  }
  bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsNull(&this->minimum_);
  uVar6 = (undefined4)i;
  uVar10 = (undefined4)(i >> 0x20);
  if (!bVar1) {
    bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsUint64(&this->minimum_);
    if (bVar1) {
      if ((this->exclusiveMinimum_ & 1U) == 0) {
        uVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetUint64
                          (&this->minimum_);
        if (i < uVar4) goto LAB_0015d917;
      }
      else {
        uVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetUint64
                          (&this->minimum_);
        if (i <= uVar4) {
LAB_0015d917:
          (*context->error_handler->_vptr_IValidationErrorHandler[9])
                    (context->error_handler,i,&this->minimum_,(ulong)(this->exclusiveMinimum_ & 1));
          VVar5 = kValidateErrorMinimum;
          if ((this->exclusiveMinimum_ & 1U) != 0) {
            VVar5 = kValidateErrorExclusiveMinimum;
          }
          context->invalidCode = VVar5;
          VVar5 = kValidateErrorMinimum;
          if ((this->exclusiveMinimum_ & 1U) != 0) {
            VVar5 = kValidateErrorExclusiveMinimum;
          }
          pVVar2 = GetValidateErrorKeyword(VVar5);
          pCVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetString(pVVar2);
          context->invalidKeyword = pCVar3;
          return false;
        }
      }
    }
    else {
      bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsInt64(&this->minimum_)
      ;
      if ((!bVar1) &&
         (auVar7._8_4_ = uVar10, auVar7._0_8_ = i, auVar7._12_4_ = 0x45300000,
         bVar1 = CheckDoubleMinimum(this,context,
                                    (auVar7._8_8_ - 1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0)),
         !bVar1)) {
        return false;
      }
    }
  }
  bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsNull(&this->maximum_);
  if (!bVar1) {
    bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsUint64(&this->maximum_);
    if (bVar1) {
      if ((this->exclusiveMaximum_ & 1U) == 0) {
        uVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetUint64
                          (&this->maximum_);
        if (uVar4 < i) goto LAB_0015da8d;
      }
      else {
        uVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetUint64
                          (&this->maximum_);
        if (uVar4 <= i) {
LAB_0015da8d:
          (*context->error_handler->_vptr_IValidationErrorHandler[6])
                    (context->error_handler,i,&this->maximum_,(ulong)(this->exclusiveMaximum_ & 1));
          VVar5 = kValidateErrorMaximum;
          if ((this->exclusiveMaximum_ & 1U) != 0) {
            VVar5 = kValidateErrorExclusiveMaximum;
          }
          context->invalidCode = VVar5;
          VVar5 = kValidateErrorMaximum;
          if ((this->exclusiveMaximum_ & 1U) != 0) {
            VVar5 = kValidateErrorExclusiveMaximum;
          }
          pVVar2 = GetValidateErrorKeyword(VVar5);
          pCVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetString(pVVar2);
          context->invalidKeyword = pCVar3;
          return false;
        }
      }
    }
    else {
      bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsInt64(&this->maximum_)
      ;
      if (bVar1) {
        (*context->error_handler->_vptr_IValidationErrorHandler[6])
                  (context->error_handler,i,&this->maximum_,(ulong)(this->exclusiveMaximum_ & 1));
        VVar5 = kValidateErrorMaximum;
        if ((this->exclusiveMaximum_ & 1U) != 0) {
          VVar5 = kValidateErrorExclusiveMaximum;
        }
        context->invalidCode = VVar5;
        VVar5 = kValidateErrorMaximum;
        if ((this->exclusiveMaximum_ & 1U) != 0) {
          VVar5 = kValidateErrorExclusiveMaximum;
        }
        pVVar2 = GetValidateErrorKeyword(VVar5);
        pCVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(pVVar2);
        context->invalidKeyword = pCVar3;
        return false;
      }
      auVar8._8_4_ = uVar10;
      auVar8._0_8_ = i;
      auVar8._12_4_ = 0x45300000;
      bVar1 = CheckDoubleMaximum(this,context,
                                 (auVar8._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0));
      if (!bVar1) {
        return false;
      }
    }
  }
  bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsNull(&this->multipleOf_);
  if (!bVar1) {
    bVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsUint64
                      (&this->multipleOf_);
    if (bVar1) {
      uVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetUint64
                        (&this->multipleOf_);
      if (i % uVar4 != 0) {
        (*context->error_handler->_vptr_IValidationErrorHandler[3])
                  (context->error_handler,i,&this->multipleOf_);
        context->invalidCode = kValidateErrorMultipleOf;
        pVVar2 = GetValidateErrorKeyword(kValidateErrorMultipleOf);
        pCVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(pVVar2);
        context->invalidKeyword = pCVar3;
        return false;
      }
    }
    else {
      auVar9._8_4_ = uVar10;
      auVar9._0_8_ = i;
      auVar9._12_4_ = 0x45300000;
      bVar1 = CheckDoubleMultipleOf
                        (this,context,
                         (auVar9._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0));
      if (!bVar1) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool CheckUint(Context& context, uint64_t i) const {
        if (!(type_ & ((1 << kIntegerSchemaType) | (1 << kNumberSchemaType)))) {
            DisallowedType(context, GetIntegerString());
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorType);
        }

        if (!minimum_.IsNull()) {
            if (minimum_.IsUint64()) {
                if (exclusiveMinimum_ ? i <= minimum_.GetUint64() : i < minimum_.GetUint64()) {
                    context.error_handler.BelowMinimum(i, minimum_, exclusiveMinimum_);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(exclusiveMinimum_ ? kValidateErrorExclusiveMinimum : kValidateErrorMinimum);
                }
            }
            else if (minimum_.IsInt64())
                /* do nothing */; // i >= 0 > minimum.Getint64()
            else if (!CheckDoubleMinimum(context, static_cast<double>(i)))
                return false;
        }

        if (!maximum_.IsNull()) {
            if (maximum_.IsUint64()) {
                if (exclusiveMaximum_ ? i >= maximum_.GetUint64() : i > maximum_.GetUint64()) {
                    context.error_handler.AboveMaximum(i, maximum_, exclusiveMaximum_);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(exclusiveMaximum_ ? kValidateErrorExclusiveMaximum : kValidateErrorMaximum);
                }
            }
            else if (maximum_.IsInt64()) {
                context.error_handler.AboveMaximum(i, maximum_, exclusiveMaximum_);
                RAPIDJSON_INVALID_KEYWORD_RETURN(exclusiveMaximum_ ? kValidateErrorExclusiveMaximum : kValidateErrorMaximum); // i >= 0 > maximum_
            }
            else if (!CheckDoubleMaximum(context, static_cast<double>(i)))
                return false;
        }

        if (!multipleOf_.IsNull()) {
            if (multipleOf_.IsUint64()) {
                if (i % multipleOf_.GetUint64() != 0) {
                    context.error_handler.NotMultipleOf(i, multipleOf_);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorMultipleOf);
                }
            }
            else if (!CheckDoubleMultipleOf(context, static_cast<double>(i)))
                return false;
        }

        return true;
    }